

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

nghttp3_ssize
nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,uint8_t *src,size_t srclen)

{
  byte *end_00;
  nghttp3_rcbuf **rcbuf_ptr;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  int rfin;
  nghttp3_ssize nread;
  nghttp3_mem *mem;
  int busy;
  int rv;
  uint8_t *end;
  uint8_t *p;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined3 uVar1;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  nghttp3_qpack_decoder *in_stack_ffffffffffffffb8;
  nghttp3_qpack_read_state *rstate;
  int iVar2;
  uint in_stack_ffffffffffffffcc;
  byte *local_28;
  nghttp3_ssize local_8;
  
  iVar2 = 0;
  rstate = *(nghttp3_qpack_read_state **)(in_RDI + 0x30);
  if (*(char *)(in_RDI + 0x68) == '\0') {
    if (in_RDX == 0) {
      local_8 = 0;
    }
    else {
      *(long *)(in_RDI + 0x130) = in_RDX + *(long *)(in_RDI + 0x130);
      if (*(ulong *)(in_RDI + 0x130) < 0x20001) {
        end_00 = in_RSI + in_RDX;
        local_28 = in_RSI;
switchD_0010e626_default:
        uVar1 = (undefined3)in_stack_ffffffffffffffb0;
        in_stack_ffffffffffffffb0 = CONCAT13(1,uVar1);
        if (local_28 == end_00) {
          in_stack_ffffffffffffffb0 = CONCAT13(iVar2 != 0,uVar1);
        }
        if ((char)((uint)in_stack_ffffffffffffffb0 >> 0x18) == '\0') {
          return (long)local_28 - (long)in_RSI;
        }
        iVar2 = 0;
        rcbuf_ptr = (nghttp3_rcbuf **)(ulong)*(uint *)(in_RDI + 0x70);
        switch(rcbuf_ptr) {
        case (nghttp3_rcbuf **)0x0:
          in_stack_ffffffffffffffa4 = *local_28 & 0xffffffe0;
          if (in_stack_ffffffffffffffa4 == 0x20) {
            *(undefined4 *)(in_RDI + 0x74) = 3;
            *(undefined8 *)(in_RDI + 0xd8) = 5;
            *(undefined4 *)(in_RDI + 0x70) = 1;
          }
          else if ((in_stack_ffffffffffffffa4 == 0x40) || (in_stack_ffffffffffffffa4 == 0x60)) {
            *(undefined4 *)(in_RDI + 0x74) = 1;
            *(undefined4 *)(in_RDI + 0xf4) = 0;
            *(undefined8 *)(in_RDI + 0xd8) = 5;
            *(undefined4 *)(in_RDI + 0x70) = 2;
          }
          else if ((((in_stack_ffffffffffffffa4 == 0x80) || (in_stack_ffffffffffffffa4 == 0xa0)) ||
                   (in_stack_ffffffffffffffa4 == 0xc0)) || (in_stack_ffffffffffffffa4 == 0xe0)) {
            *(undefined4 *)(in_RDI + 0x74) = 0;
            *(uint *)(in_RDI + 0xf4) = (uint)(((*local_28 & 0x40) != 0 ^ 0xffU) & 1);
            *(undefined8 *)(in_RDI + 0xd8) = 6;
            *(undefined4 *)(in_RDI + 0x70) = 1;
          }
          else {
            *(undefined4 *)(in_RDI + 0x74) = 2;
            *(undefined4 *)(in_RDI + 0xf4) = 1;
            *(undefined8 *)(in_RDI + 0xd8) = 5;
            *(undefined4 *)(in_RDI + 0x70) = 1;
          }
          goto switchD_0010e626_default;
        case (nghttp3_rcbuf **)0x1:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_varint((int *)&stack0xffffffffffffffb4,
                                 (nghttp3_qpack_read_state *)(in_RDI + 0x78),local_28,end_00);
          if ((long)in_stack_ffffffffffffffb8 < 0) {
            if (in_stack_ffffffffffffffb8 != (nghttp3_qpack_decoder *)0xffffffffffffff94) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb2e,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            in_stack_ffffffffffffffcc = 0xfffffe6e;
          }
          else {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (in_stack_ffffffffffffffb4 == 0) {
              return (long)local_28 - (long)in_RSI;
            }
            if (*(int *)(in_RDI + 0x74) == 3) {
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_set_max_dtable_capacity
                             (in_stack_ffffffffffffffb8,
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              if (in_stack_ffffffffffffffcc == 0) {
                *(undefined4 *)(in_RDI + 0x70) = 0;
                nghttp3_qpack_read_state_reset((nghttp3_qpack_read_state *)0x10e881);
                goto switchD_0010e626_default;
              }
              in_stack_ffffffffffffffcc = 0xfffffe6e;
            }
            else {
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_rel2abs
                             ((nghttp3_qpack_decoder *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (nghttp3_qpack_read_state *)0x10e899);
              if (-1 < (int)in_stack_ffffffffffffffcc) {
                in_stack_ffffffffffffffa0 = *(int *)(in_RDI + 0x74);
                if (in_stack_ffffffffffffffa0 == 0) {
                  *(undefined8 *)(in_RDI + 0xd8) = 7;
                  *(undefined4 *)(in_RDI + 0x70) = 6;
                  goto switchD_0010e626_default;
                }
                if (in_stack_ffffffffffffffa0 != 2) {
                  nghttp3_unreachable_fail
                            ((char *)rstate,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
                }
                in_stack_ffffffffffffffcc =
                     nghttp3_qpack_decoder_dtable_duplicate_add(in_stack_ffffffffffffffb8);
                if (in_stack_ffffffffffffffcc == 0) {
                  *(undefined4 *)(in_RDI + 0x70) = 0;
                  nghttp3_qpack_read_state_reset((nghttp3_qpack_read_state *)0x10e8fa);
                  goto switchD_0010e626_default;
                }
              }
            }
          }
          break;
        case (nghttp3_rcbuf **)0x2:
          qpack_read_state_check_huffman((nghttp3_qpack_read_state *)(in_RDI + 0x78),*local_28);
          *(undefined4 *)(in_RDI + 0x70) = 3;
          *(undefined8 *)(in_RDI + 0xd0) = 0;
          *(undefined8 *)(in_RDI + 0xe0) = 0;
        case (nghttp3_rcbuf **)0x3:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_varint((int *)&stack0xffffffffffffffb4,
                                 (nghttp3_qpack_read_state *)(in_RDI + 0x78),local_28,end_00);
          if ((long)in_stack_ffffffffffffffb8 < 0) {
            if (in_stack_ffffffffffffffb8 != (nghttp3_qpack_decoder *)0xffffffffffffff94) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb6b,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            in_stack_ffffffffffffffcc = 0xfffffe6e;
          }
          else {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (in_stack_ffffffffffffffb4 == 0) {
              return (long)local_28 - (long)in_RSI;
            }
            if (*(ulong *)(in_RDI + 0xd0) < 0x101) {
              if (*(int *)(in_RDI + 0xf8) == 0) {
                *(undefined4 *)(in_RDI + 0x70) = 5;
                in_stack_ffffffffffffffcc =
                     nghttp3_rcbuf_new(rcbuf_ptr,
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                       ,(nghttp3_mem *)
                                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
              }
              else {
                *(undefined4 *)(in_RDI + 0x70) = 4;
                nghttp3_qpack_huffman_decode_context_init
                          ((nghttp3_qpack_huffman_decode_context *)(in_RDI + 0x78));
                in_stack_ffffffffffffffcc =
                     nghttp3_rcbuf_new(rcbuf_ptr,
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                       ,(nghttp3_mem *)
                                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
              }
              if (in_stack_ffffffffffffffcc == 0) {
                nghttp3_buf_wrap_init
                          ((nghttp3_buf *)(in_RDI + 0x80),
                           *(uint8_t **)(*(long *)(in_RDI + 0xc0) + 8),
                           *(size_t *)(*(long *)(in_RDI + 0xc0) + 0x10));
                goto switchD_0010e626_default;
              }
            }
            else {
              in_stack_ffffffffffffffcc = 0xffffff93;
            }
          }
          break;
        case (nghttp3_rcbuf **)0x4:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_huffman_string
                         ((nghttp3_qpack_read_state *)((ulong)in_stack_ffffffffffffffcc << 0x20),
                          (nghttp3_buf *)rstate,(uint8_t *)in_stack_ffffffffffffffb8,
                          (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (-1 < (long)in_stack_ffffffffffffffb8) {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (*(long *)(in_RDI + 0xd0) != 0) {
              return (long)local_28 - (long)in_RSI;
            }
            qpack_read_state_terminate_name((nghttp3_qpack_read_state *)0x10ebae);
            *(undefined4 *)(in_RDI + 0x70) = 6;
            *(undefined8 *)(in_RDI + 0xd8) = 7;
            goto switchD_0010e626_default;
          }
          if (in_stack_ffffffffffffffb8 != (nghttp3_qpack_decoder *)0xffffffffffffff94) {
            __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                          "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                          ,0xb91,
                          "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                         );
          }
          in_stack_ffffffffffffffcc = 0xfffffe6e;
          break;
        case (nghttp3_rcbuf **)0x5:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_string(rstate,(nghttp3_buf *)in_stack_ffffffffffffffb8,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (uint8_t *)rcbuf_ptr);
          if (-1 < (long)in_stack_ffffffffffffffb8) {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (*(long *)(in_RDI + 0xd0) != 0) {
              return (long)local_28 - (long)in_RSI;
            }
            qpack_read_state_terminate_name((nghttp3_qpack_read_state *)0x10ec52);
            *(undefined4 *)(in_RDI + 0x70) = 6;
            *(undefined8 *)(in_RDI + 0xd8) = 7;
            goto switchD_0010e626_default;
          }
          in_stack_ffffffffffffffcc = (uint)in_stack_ffffffffffffffb8;
          break;
        case (nghttp3_rcbuf **)0x6:
          qpack_read_state_check_huffman((nghttp3_qpack_read_state *)(in_RDI + 0x78),*local_28);
          *(undefined4 *)(in_RDI + 0x70) = 7;
          *(undefined8 *)(in_RDI + 0xd0) = 0;
          *(undefined8 *)(in_RDI + 0xe0) = 0;
        case (nghttp3_rcbuf **)0x7:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_varint((int *)&stack0xffffffffffffffb4,
                                 (nghttp3_qpack_read_state *)(in_RDI + 0x78),local_28,end_00);
          if ((long)in_stack_ffffffffffffffb8 < 0) {
            if (in_stack_ffffffffffffffb8 != (nghttp3_qpack_decoder *)0xffffffffffffff94) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbbd,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            in_stack_ffffffffffffffcc = 0xfffffe6e;
          }
          else {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (in_stack_ffffffffffffffb4 == 0) {
              return (long)local_28 - (long)in_RSI;
            }
            if (*(ulong *)(in_RDI + 0xd0) < 0x10001) {
              if (*(int *)(in_RDI + 0xf8) == 0) {
                *(undefined4 *)(in_RDI + 0x70) = 9;
                in_stack_ffffffffffffffcc =
                     nghttp3_rcbuf_new(rcbuf_ptr,
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                       ,(nghttp3_mem *)
                                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
              }
              else {
                *(undefined4 *)(in_RDI + 0x70) = 8;
                nghttp3_qpack_huffman_decode_context_init
                          ((nghttp3_qpack_huffman_decode_context *)(in_RDI + 0x78));
                in_stack_ffffffffffffffcc =
                     nghttp3_rcbuf_new(rcbuf_ptr,
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                       ,(nghttp3_mem *)
                                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
              }
              if (in_stack_ffffffffffffffcc == 0) {
                nghttp3_buf_wrap_init
                          ((nghttp3_buf *)(in_RDI + 0xa0),*(uint8_t **)(*(long *)(in_RDI + 200) + 8)
                           ,*(size_t *)(*(long *)(in_RDI + 200) + 0x10));
                iVar2 = 1;
                goto switchD_0010e626_default;
              }
            }
            else {
              in_stack_ffffffffffffffcc = 0xffffff93;
            }
          }
          break;
        case (nghttp3_rcbuf **)0x8:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_huffman_string
                         ((nghttp3_qpack_read_state *)((ulong)in_stack_ffffffffffffffcc << 0x20),
                          (nghttp3_buf *)rstate,(uint8_t *)in_stack_ffffffffffffffb8,
                          (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if ((long)in_stack_ffffffffffffffb8 < 0) {
            if (in_stack_ffffffffffffffb8 != (nghttp3_qpack_decoder *)0xffffffffffffff94) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbe6,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            in_stack_ffffffffffffffcc = 0xfffffe6e;
          }
          else {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (*(long *)(in_RDI + 0xd0) != 0) {
              return (long)local_28 - (long)in_RSI;
            }
            qpack_read_state_terminate_value((nghttp3_qpack_read_state *)0x10eef2);
            in_stack_ffffffffffffff9c = *(uint *)(in_RDI + 0x74);
            if (in_stack_ffffffffffffff9c == 0) {
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_dtable_indexed_add
                             ((nghttp3_qpack_decoder *)(ulong)in_stack_ffffffffffffff98);
            }
            else {
              if (in_stack_ffffffffffffff9c != 1) {
                nghttp3_unreachable_fail
                          ((char *)rstate,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              }
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_dtable_literal_add(in_stack_ffffffffffffffb8);
            }
            if (in_stack_ffffffffffffffcc == 0) {
              *(undefined4 *)(in_RDI + 0x70) = 0;
              nghttp3_qpack_read_state_reset((nghttp3_qpack_read_state *)0x10ef6d);
              goto switchD_0010e626_default;
            }
          }
          break;
        case (nghttp3_rcbuf **)0x9:
          in_stack_ffffffffffffffb8 =
               (nghttp3_qpack_decoder *)
               qpack_read_string(rstate,(nghttp3_buf *)in_stack_ffffffffffffffb8,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (uint8_t *)rcbuf_ptr);
          if ((long)in_stack_ffffffffffffffb8 < 0) {
            in_stack_ffffffffffffffcc = (uint)in_stack_ffffffffffffffb8;
          }
          else {
            local_28 = local_28 + (long)&in_stack_ffffffffffffffb8->ctx;
            if (*(long *)(in_RDI + 0xd0) != 0) {
              return (long)local_28 - (long)in_RSI;
            }
            qpack_read_state_terminate_value((nghttp3_qpack_read_state *)0x10eff5);
            in_stack_ffffffffffffff98 = *(uint *)(in_RDI + 0x74);
            if (in_stack_ffffffffffffff98 == 0) {
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_dtable_indexed_add
                             ((nghttp3_qpack_decoder *)((ulong)in_stack_ffffffffffffff9c << 0x20));
            }
            else {
              if (in_stack_ffffffffffffff98 != 1) {
                nghttp3_unreachable_fail
                          ((char *)rstate,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              }
              in_stack_ffffffffffffffcc =
                   nghttp3_qpack_decoder_dtable_literal_add(in_stack_ffffffffffffffb8);
            }
            if (in_stack_ffffffffffffffcc == 0) {
              *(undefined4 *)(in_RDI + 0x70) = 0;
              nghttp3_qpack_read_state_reset((nghttp3_qpack_read_state *)0x10f06b);
              goto switchD_0010e626_default;
            }
          }
          break;
        default:
          goto switchD_0010e626_default;
        }
        *(undefined1 *)(in_RDI + 0x68) = 1;
        return (long)(int)in_stack_ffffffffffffffcc;
      }
      local_8 = -0x192;
    }
  }
  else {
    local_8 = -0x6c;
  }
  return local_8;
}

Assistant:

nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,
                                                 const uint8_t *src,
                                                 size_t srclen) {
  const uint8_t *p = src, *end;
  int rv;
  int busy = 0;
  const nghttp3_mem *mem = decoder->ctx.mem;
  nghttp3_ssize nread;
  int rfin;

  if (decoder->ctx.bad) {
    return NGHTTP3_ERR_QPACK_FATAL;
  }

  if (srclen == 0) {
    return 0;
  }

  decoder->uninterrupted_encoderlen += srclen;
  if (decoder->uninterrupted_encoderlen > NGHTTP3_QPACK_MAX_ENCODERLEN) {
    return NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
  }

  end = src + srclen;

  for (; p != end || busy;) {
    busy = 0;
    switch (decoder->state) {
    case NGHTTP3_QPACK_ES_STATE_OPCODE:
      switch ((*p) & 0xe0) {
      case 0x80:
      case 0xa0:
      case 0xc0:
      case 0xe0:
        DEBUGF("qpack::decode: OPCODE_INSERT_INDEXED\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
        decoder->rstate.dynamic = !((*p) & 0x40);
        decoder->rstate.prefix = 6;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      case 0x40:
      case 0x60:
        DEBUGF("qpack::decode: OPCODE_INSERT\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT;
        decoder->rstate.dynamic = 0;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN;

        break;
      case 0x20:
        DEBUGF("qpack::decode: OPCODE_SET_DTABLE_TABLE_CAP\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      default:
        DEBUGF("qpack::decode: OPCODE_DUPLICATE\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_DUPLICATE;
        decoder->rstate.dynamic = 1;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;
      }
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
        DEBUGF("qpack::decode: Set dtable capacity to %" PRIu64 "\n",
               decoder->rstate.left);
        rv = nghttp3_qpack_decoder_set_max_dtable_capacity(
          decoder, (size_t)decoder->rstate.left);
        if (rv != 0) {
          rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);
        break;
      }

      rv = nghttp3_qpack_decoder_rel2abs(decoder, &decoder->rstate);
      if (rv < 0) {
        goto fail;
      }

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_DUPLICATE:
        rv = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
        if (rv != 0) {
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);

        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        decoder->rstate.prefix = 7;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;

        break;
      default:
        nghttp3_unreachable();
      }

      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_NAMELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.namebuf,
                            decoder->rstate.name->base,
                            decoder->rstate.name->len);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_VALUELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.valuebuf,
                            decoder->rstate.value->base,
                            decoder->rstate.value->len);

      /* value might be 0 length */
      busy = 1;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    }
  }

  return p - src;

fail:
  decoder->ctx.bad = 1;
  return rv;
}